

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.hpp
# Opt level: O2

bool __thiscall
tokenizer::as(tokenizer *this,list<expected_token,_std::allocator<expected_token>_> *rhs)

{
  bool bVar1;
  type_conflict1 tVar2;
  reference prVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  int iVar6;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _List_node_base *p_Var7;
  undefined1 local_3e8 [8];
  cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  lexer;
  string rest;
  pointer local_68;
  char *first;
  char *last;
  iterator_type end;
  undefined1 local_40 [8];
  iterator_type iter;
  
  local_68 = (this->text)._M_dataplus._M_p;
  first = local_68 + (this->text)._M_string_length;
  end.super_type.
  super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
  .
  super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
  .
  super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
  .queued_position =
       (multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
        )(multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
          )this;
  cpp_properties::
  cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  ::cpp_properties_lexer
            ((cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
              *)local_3e8);
  iVar6 = 0;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
  ::begin((lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
           *)local_40,(char **)local_3e8,&local_68,(char_type *)&first);
  last = (char *)0x0;
  end.super_type.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>::shared<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>_*,_0>
  .member = (shared<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
             *)0x0;
  p_Var7 = (_List_node_base *)rhs;
  while( true ) {
    p_Var7 = (((_List_base<expected_token,_std::allocator<expected_token>_> *)&p_Var7->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    bVar1 = boost::spirit::
            multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
            ::operator!=((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                          *)local_40,
                         (multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                          *)&last);
    if (!bVar1) break;
    prVar3 = boost::spirit::iterator_policies::split_std_deque::
             unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
             ::
             dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                       ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_40);
    if ((0xfffffffffffffffd <
         (prVar3->
         super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
         ).
         super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
         .id_ - 1) || (p_Var7 == (_List_node_base *)rhs)) break;
    prVar3 = boost::spirit::iterator_policies::split_std_deque::
             unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
             ::
             dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                       ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_40);
    if ((_List_node_base *)
        (prVar3->
        super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
        ).
        super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
        .id_ != p_Var7[1]._M_next) {
      poVar4 = std::operator<<((ostream *)&std::cout,"state: ");
      boost::spirit::iterator_policies::split_std_deque::
      unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
      ::
      dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_40);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"id: expected=");
      this_00 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)end.super_type.
                          super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
                          .
                          super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
                          .
                          super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
                          .queued_position + 0x20);
      lexer.
      super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
      .self.targetstate.field_2._8_4_ = *(undefined4 *)&p_Var7[1]._M_next;
      pmVar5 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)
                                    (lexer.
                                     super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                                     .self.targetstate.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,(string *)pmVar5);
      poVar4 = std::operator<<(poVar4,", actual=");
      prVar3 = boost::spirit::iterator_policies::split_std_deque::
               unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
               ::
               dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                         ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                           *)local_40);
      rest.field_2._12_4_ =
           (undefined4)
           (prVar3->
           super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
           ).
           super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
           .id_;
      pmVar5 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)(rest.field_2._M_local_buf + 0xc));
      poVar4 = std::operator<<(poVar4,(string *)pmVar5);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"string:>");
      boost::spirit::iterator_policies::split_std_deque::
      unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
      ::
      dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_40);
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      std::operator<<(poVar4,"<\n");
      goto LAB_001066e8;
    }
    prVar3 = boost::spirit::iterator_policies::split_std_deque::
             unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
             ::
             dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                       ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_40);
    tVar2 = boost::operator!=(&prVar3->value_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var7[1]._M_prev);
    if (tVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"state: ");
      boost::spirit::iterator_policies::split_std_deque::
      unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
      ::
      dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_40);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"id: ");
      prVar3 = boost::spirit::iterator_policies::split_std_deque::
               unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
               ::
               dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                         ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                           *)local_40);
      lexer.
      super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
      .self.targetstate.field_2._8_4_ =
           (int)(prVar3->
                super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
                ).
                super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
                .id_;
      pmVar5 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)end.super_type.
                                      super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
                                      .
                                      super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
                                      .
                                      super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
                                      .queued_position + 0x20),
                            (key_type *)
                            (lexer.
                             super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                             .self.targetstate.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,(string *)pmVar5);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"string: expected=>");
      boost::spirit::iterator_policies::split_std_deque::
      unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
      ::
      dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_40);
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      poVar4 = std::operator<<(poVar4,"<, actual=>");
      poVar4 = std::operator<<(poVar4,(string *)&p_Var7[1]._M_prev);
      std::operator<<(poVar4,"<\n");
      goto LAB_001066e8;
    }
    boost::spirit::iterator_policies::split_std_deque::
    unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
    ::
    increment<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
              ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                *)local_40);
    iVar6 = iVar6 + 1;
  }
  bVar1 = boost::spirit::
          multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
          ::operator==((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                        *)local_40,
                       (multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                        *)&last);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"*** Debug: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
    std::operator<<(poVar4," token(s) found\n");
    if (p_Var7 == (_List_node_base *)rhs) {
      bVar1 = true;
      goto LAB_001066ea;
    }
    std::operator<<((ostream *)&std::cout,"missing expected tokens\n");
  }
  else {
    lexer.
    super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
    .self.targetstate.field_2._8_8_ = &rest._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               ((long)&lexer.
                       super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                       .self.targetstate.field_2 + 8),local_68,first);
    poVar4 = std::operator<<((ostream *)&std::cout,"Lexical analysis failed\n");
    poVar4 = std::operator<<(poVar4,"stopped at: \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    (lexer.
                                     super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                                     .self.targetstate.field_2._M_local_buf + 8));
    std::operator<<(poVar4,"\"\n");
    std::__cxx11::string::~string
              ((string *)
               (lexer.
                super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                .self.targetstate.field_2._M_local_buf + 8));
  }
LAB_001066e8:
  bVar1 = false;
LAB_001066ea:
  boost::spirit::
  multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                 *)&last);
  boost::spirit::
  multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                 *)local_40);
  boost::spirit::lex::
  lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  ::~lexer((lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
            *)local_3e8);
  return bVar1;
}

Assistant:

bool as(const list<value_type>& rhs) {
        char const* first = text.c_str();
        char const* last = &first[text.size()];

        cp::cpp_properties_lexer<lexer_type> lexer;
        lexer_type::iterator_type iter = lexer.begin(first, last);
        lexer_type::iterator_type end = lexer.end();

        list<value_type>::const_iterator citer_expected = rhs.cbegin();
        list<value_type>::const_iterator cend_expected = rhs.cend();

        int i = 0;
        while (iter != end && token_is_valid(*iter) && citer_expected != cend_expected) {
            if (iter->id() != citer_expected->id) {
                std::cout << "state: " << iter->state() << ", "
                            << "id: expected=" << name[citer_expected->id] << ", actual=" << name[iter->id()] << ", "
                          << "string:>" << iter->value() << "<\n";
                return false;
            }
            if (iter->value() != citer_expected->value) {
            std::cout << "state: " << iter->state() << ", "
                      << "id: " << name[iter->id()] << ", "
                      << "string: expected=>" << iter->value() << "<, actual=>" << citer_expected->value << "<\n";
                return false;
            }
            ++i;
            ++iter;
            ++citer_expected;
        }
        if (iter == end) {
            std::cout << "*** Debug: " << i << " token(s) found\n";
            if (citer_expected != cend_expected) {
                std::cout << "missing expected tokens\n";
                return false;
            } else {
                return true;
            }
        } else {
            std::string rest(first, last);
            std::cout << "Lexical analysis failed\n" << "stopped at: \""
                      << rest << "\"\n";
        }
        return false;
    }